

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FMD5Holder,_FCompatValues,_FMD5HashTraits,_TValueTraits<FCompatValues>_>::NewKey
          (TMap<FMD5Holder,_FCompatValues,_FMD5HashTraits,_TValueTraits<FCompatValues>_> *this,
          FMD5Holder key)

{
  Node *pNVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Node *pNVar4;
  uint uVar5;
  Node *pNVar6;
  Node *pNVar7;
  
  while (uVar5 = this->Size - 1 & key.Hash, pNVar1 = this->Nodes + uVar5,
        this->Nodes[uVar5].Next != (Node *)0x1) {
    pNVar4 = GetFreePos(this);
    if (pNVar4 != (Node *)0x0) {
      pNVar7 = this->Nodes + (this->Size - 1 & (pNVar1->Pair).Key.DWords[0]);
      if (this->Nodes + (this->Size - 1 & (pNVar1->Pair).Key.DWords[0]) != pNVar1)
      goto LAB_0042e870;
      pNVar4->Next = pNVar1->Next;
      pNVar7 = pNVar4;
      goto LAB_0042e89e;
    }
    Rehash(this);
  }
LAB_0042e899:
  pNVar4 = (Node *)0x0;
  pNVar7 = pNVar1;
LAB_0042e89e:
  pNVar1->Next = pNVar4;
  this->NumUsed = this->NumUsed + 1;
  *(long *)&(pNVar7->Pair).Key = key._0_8_;
  *(long *)((long)&(pNVar7->Pair).Key + 8) = key._8_8_;
  return pNVar7;
LAB_0042e870:
  do {
    pNVar6 = pNVar7;
    pNVar7 = pNVar6->Next;
  } while (pNVar7 != pNVar1);
  pNVar6->Next = pNVar4;
  *(undefined8 *)((pNVar4->Pair).Value.CompatFlags + 2) =
       *(undefined8 *)((pNVar1->Pair).Value.CompatFlags + 2);
  pNVar7 = pNVar1->Next;
  uVar2 = *(undefined8 *)&(pNVar1->Pair).Key;
  uVar3 = *(undefined8 *)(pNVar1->Pair).Value.CompatFlags;
  *(undefined8 *)((long)&(pNVar4->Pair).Key + 8) = *(undefined8 *)((long)&(pNVar1->Pair).Key + 8);
  *(undefined8 *)(pNVar4->Pair).Value.CompatFlags = uVar3;
  pNVar4->Next = pNVar7;
  *(undefined8 *)&(pNVar4->Pair).Key = uVar2;
  goto LAB_0042e899;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}